

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionBlocker.h
# Opt level: O3

void __thiscall cmFunctionBlocker::~cmFunctionBlocker(cmFunctionBlocker *this)

{
  long *plVar1;
  _Alloc_hider _Var2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  this->_vptr_cmFunctionBlocker = (_func_int **)&PTR__cmFunctionBlocker_009a1ab0;
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&this->Functions);
  if ((this->StartingContext).DeferId.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    (this->StartingContext).DeferId.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    _Var2._M_p = (this->StartingContext).DeferId.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    plVar1 = (long *)((long)&(this->StartingContext).DeferId.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 0x10);
    if ((long *)_Var2._M_p != plVar1) {
      operator_delete(_Var2._M_p,*plVar1 + 1);
    }
  }
  pcVar3 = (this->StartingContext).FilePath._M_dataplus._M_p;
  paVar4 = &(this->StartingContext).FilePath.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->StartingContext).Name._M_dataplus._M_p;
  paVar4 = &(this->StartingContext).Name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~cmFunctionBlocker() = default;